

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall duckdb::ColumnData::SetStart(ColumnData *this,idx_t new_start)

{
  ColumnSegment *segment;
  __pointer_type pCVar1;
  long lVar2;
  
  this->start = new_start;
  pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                     (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  if (pCVar1 != (ColumnSegment *)0x0) {
    lVar2 = 0;
    do {
      (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start = this->start + lVar2;
      lVar2 = lVar2 + (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
                      super___atomic_base<unsigned_long>._M_i;
      pCVar1 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
    } while (pCVar1 != (__pointer_type)0x0);
  }
  SegmentTree<duckdb::ColumnSegment,_false>::Reinitialize
            (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  return;
}

Assistant:

void ColumnData::SetStart(idx_t new_start) {
	this->start = new_start;
	idx_t offset = 0;
	for (auto &segment : data.Segments()) {
		segment.start = start + offset;
		offset += segment.count;
	}
	data.Reinitialize();
}